

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_53f39::OpenXrProgram::InitializeSystem(OpenXrProgram *this)

{
  XrSystemId XVar1;
  XrResult res;
  element_type *peVar2;
  char *pcVar3;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  undefined8 uStack_88;
  XrSystemGetInfo systemInfo;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  OpenXrProgram *local_10;
  OpenXrProgram *this_local;
  
  local_10 = this;
  if (this->m_instance == (XrInstance)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Check failed",&local_31);
    Throw((string *)local_30,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:296"
         );
  }
  if (this->m_systemId != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Check failed",(allocator *)&systemInfo.field_0x17);
    Throw((string *)local_68,"m_systemId == XR_NULL_SYSTEM_ID",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:297"
         );
  }
  systemInfo.next = (void *)0x0;
  uStack_88 = 4;
  systemInfo.type = XR_TYPE_UNKNOWN;
  systemInfo._4_4_ = 0;
  peVar2 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_options);
  systemInfo.next = (void *)CONCAT44(systemInfo.next._4_4_,(peVar2->Parsed).FormFactor);
  res = xrGetSystem(this->m_instance,&uStack_88,&this->m_systemId);
  CheckXrResult(res,"xrGetSystem(m_instance, &systemInfo, &m_systemId)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:301"
               );
  XVar1 = this->m_systemId;
  peVar2 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_options);
  pcVar3 = to_string((peVar2->Parsed).FormFactor);
  Fmt_abi_cxx11_((char *)local_a8,"Using system %d for form factor %s",XVar1,pcVar3);
  Log::Write(Verbose,local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  if (this->m_instance == (XrInstance)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Check failed",&local_c9);
    Throw((string *)local_c8,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:305"
         );
  }
  if (this->m_systemId == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Check failed",&local_f1);
    Throw((string *)local_f0,"m_systemId != XR_NULL_SYSTEM_ID",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:306"
         );
  }
  return;
}

Assistant:

void InitializeSystem() override {
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_systemId == XR_NULL_SYSTEM_ID);

        XrSystemGetInfo systemInfo{XR_TYPE_SYSTEM_GET_INFO};
        systemInfo.formFactor = m_options->Parsed.FormFactor;
        CHECK_XRCMD(xrGetSystem(m_instance, &systemInfo, &m_systemId));

        Log::Write(Log::Level::Verbose,
                   Fmt("Using system %d for form factor %s", m_systemId, to_string(m_options->Parsed.FormFactor)));
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_systemId != XR_NULL_SYSTEM_ID);
    }